

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::opt_expr
          (compiler_type *this,tree_type<cs::token_base_*> *tree,iterator it,optm_type do_optm)

{
  initializer_list<cs_impl::any> __l;
  bool bVar1;
  int iVar2;
  signal_types sVar3;
  token_base **pptVar4;
  element_type *this_00;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar5;
  bool *pbVar6;
  undefined8 uVar7;
  callable *this_01;
  object_method *poVar8;
  token_value *ptVar9;
  int in_ECX;
  tree_node *in_RDX;
  compiler_type *in_RSI;
  iterator in_RDI;
  token_value *token_1;
  token_base *oldt_4;
  any *it_4;
  const_iterator __end10;
  const_iterator __begin10;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__range10;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *arr_2;
  tree_type<cs::token_base_*> *tree_8;
  iterator __end8;
  iterator __begin8;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range8;
  vector args_1;
  object_method *om;
  token_base *oldt_3;
  tree_type<cs::token_base_*> *tree_7;
  iterator __end7_1;
  iterator __begin7_1;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range7_1;
  token_base *ptr_3;
  any *it_3;
  const_iterator __end9;
  const_iterator __begin9;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__range9;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *arr_1;
  tree_type<cs::token_base_*> *tree_6;
  iterator __end7;
  iterator __begin7;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range7;
  vector args;
  token_base *oldt_2;
  tree_type<cs::token_base_*> *tree_5;
  iterator __end6;
  iterator __begin6;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range6;
  token_base *ptr_2;
  var *a_1;
  token_base *rptr_1;
  token_base *lptr_1;
  var *v;
  token_base *orig_ptr;
  var *a;
  token_base *rptr;
  token_base *lptr;
  tree_type<cs::token_base_*> ltree;
  token_value *val;
  token_signal *sig;
  tree_type<cs::token_base_*> *tree_4;
  iterator __end3_3;
  iterator __begin3_3;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range3_3;
  any *it_2;
  iterator __end3_2;
  iterator __begin3_2;
  array *__range3_2;
  any *it_1;
  const_iterator __end5;
  const_iterator __begin5;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__range5;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *child_arr;
  tree_type<cs::token_base_*> *tree_3;
  iterator __end3_1;
  iterator __begin3_1;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range3_1;
  array arr;
  token_base *oldt_1;
  tree_type<cs::token_base_*> *child_tree;
  tree_type<cs::token_base_*> *tree_2;
  iterator __end3;
  iterator __begin3;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range3;
  token_base *ptr_1;
  tree_type<cs::token_base_*> *tree_1;
  token_base *oldt;
  token_literal *ptr;
  var value;
  token_base *token;
  _Self *in_stack_fffffffffffff2f8;
  iterator in_stack_fffffffffffff300;
  compiler_type *in_stack_fffffffffffff308;
  type_info *in_stack_fffffffffffff310;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffff318;
  compiler_type *in_stack_fffffffffffff320;
  allocator_type *in_stack_fffffffffffff328;
  compiler_type *in_stack_fffffffffffff330;
  domain_manager *in_stack_fffffffffffff338;
  iterator *in_stack_fffffffffffff340;
  iterator *in_stack_fffffffffffff348;
  iterator it_00;
  undefined7 in_stack_fffffffffffff350;
  undefined1 in_stack_fffffffffffff357;
  bool bVar10;
  iterator in_stack_fffffffffffff358;
  element_type *in_stack_fffffffffffff380;
  string *in_stack_fffffffffffff3d8;
  string *in_stack_fffffffffffff3e0;
  runtime_type *in_stack_fffffffffffff3e8;
  undefined8 ****ppppuVar11;
  undefined8 ****local_c10;
  token_value *local_aa0;
  token_base *in_stack_fffffffffffff568;
  var *in_stack_fffffffffffff570;
  runtime_type *in_stack_fffffffffffff578;
  token_signal *local_a68;
  byte local_932;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_870;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_850;
  tree_node *local_848;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_838;
  tree_node *local_830;
  reference local_828;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_800;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_7e0;
  undefined1 ****local_7d0;
  undefined8 ***local_7c8;
  undefined1 ****local_7c0;
  undefined8 local_7b8;
  object_method *local_798;
  token_base *local_790;
  tree_node *local_788;
  tree_node *local_780;
  tree_node *local_778;
  reference local_770;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_748;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_728;
  token_expand *local_720;
  tree_node *local_710;
  reference local_6f0;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_6c8;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_6a8;
  tree_node *local_6a0;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_690;
  tree_node *local_688;
  reference local_680;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_658;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_638;
  token_base *local_618;
  tree_node *local_610;
  tree_node *local_608;
  tree_node *local_600;
  reference local_5f8;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_5d0;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_5b0;
  token_expand *local_5a8;
  var *local_5a0;
  undefined1 local_592;
  allocator local_591;
  string local_590 [32];
  tree_node *local_570;
  token_arglist *local_568;
  tree_node *local_560;
  token_value *local_558;
  tree_node *local_550;
  tree_node *local_548;
  any local_530;
  any *local_528;
  token_base *local_520;
  var *local_518;
  undefined1 local_50a;
  allocator local_509;
  string local_508 [32];
  tree_node *local_4e8;
  token_base *local_4e0;
  tree_node *local_4d8;
  token_value *local_4d0;
  tree_node *local_4c8;
  tree_node *local_4c0;
  tree_node *local_4b0;
  undefined1 local_4a2;
  allocator local_4a1;
  string local_4a0 [32];
  tree_node *local_480;
  tree_node *local_478;
  tree_node *local_470;
  undefined1 local_462;
  allocator local_461;
  string local_460 [40];
  tree_node *local_438;
  tree_node *local_430;
  tree_node *local_428;
  tree_node *local_420;
  tree_node *local_418;
  tree_node *local_410;
  token_value *local_408;
  tree_node *local_400;
  tree_node *local_3f8;
  tree_node *local_3f0;
  tree_node *local_3e8;
  tree_node *local_3e0;
  undefined1 local_3d2;
  allocator local_3d1;
  string local_3d0 [15];
  undefined1 in_stack_fffffffffffffc3f;
  iterator *in_stack_fffffffffffffc40;
  runtime_type *in_stack_fffffffffffffc48;
  allocator local_389;
  string local_388 [32];
  tree_node *local_368;
  tree_node *local_360;
  tree_node *local_358;
  undefined1 local_34a;
  allocator local_349;
  string local_348 [32];
  tree_node *local_328;
  undefined1 local_31a;
  allocator local_319;
  string local_318 [32];
  tree_node *local_2f8;
  reference local_2f0;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_2c8;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_2a8;
  reference local_298;
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> local_270;
  undefined1 *local_250;
  tree_node *local_248;
  EVP_PKEY_CTX local_240 [8];
  EVP_PKEY_CTX local_238 [8];
  EVP_PKEY_CTX local_230 [8];
  EVP_PKEY_CTX local_228 [8];
  reference local_220;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_1f8;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_1d8;
  tree_node *local_1d0;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_1c0;
  tree_node *local_1b8;
  reference local_1b0;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_188;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_168;
  undefined1 local_160 [80];
  token_base *local_110;
  tree_node *local_108;
  tree_node *local_100;
  tree_type<cs::token_base_*> *local_f8;
  tree_node *local_f0;
  reference local_e8;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_c0;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_a0;
  token_expand *local_98;
  tree_node *local_90;
  tree_type<cs::token_base_*> *local_88;
  token_base *local_78;
  token_array *local_70;
  byte local_63;
  byte local_62;
  allocator local_61;
  string local_60 [48];
  any local_30;
  optm_type oVar12;
  token_array *this_02;
  undefined4 in_stack_ffffffffffffffe0;
  compiler_type *this_03;
  iterator local_8;
  
  local_8.mData = in_RDX;
  bVar1 = tree_type<cs::token_base_*>::iterator::usable(&local_8);
  if (!bVar1) {
    return;
  }
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
  local_70 = (token_array *)*pptVar4;
  if (local_70 == (token_array *)0x0) {
    return;
  }
  iVar2 = (*(local_70->super_token_base)._vptr_token_base[2])();
  switch(iVar2) {
  case 3:
    sVar3 = token_signal::get_signal((token_signal *)local_70);
    oVar12 = (optm_type)((ulong)local_70 >> 0x20);
    switch(sVar3) {
    case dot_:
      local_4c0 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      tree_type<cs::token_base_*>::tree_type
                ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8,in_stack_fffffffffffff300)
      ;
      local_4c8 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               in_RDI,oVar12);
      local_4d8 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      local_4d0 = (token_value *)*pptVar4;
      local_4e8 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      local_4e0 = *pptVar4;
      if ((local_4e0 == (token_base *)0x0) ||
         (iVar2 = (*local_4e0->_vptr_token_base[2])(), iVar2 != 4)) {
        local_50a = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_508,"Wrong grammar for dot expression.",&local_509);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffff300.mData,
                   (string *)in_stack_fffffffffffff2f8);
        local_50a = 0;
        __cxa_throw(uVar7,&compile_error::typeinfo,compile_error::~compile_error);
      }
      if ((local_4d0 != (token_value *)0x0) &&
         (iVar2 = (*(local_4d0->super_token_base)._vptr_token_base[2])(), iVar2 == 7)) {
        local_518 = token_value::get_value(local_4d0);
        pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
        local_520 = *pptVar4;
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1515b2);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1515be);
        runtime_type::parse_dot
                  (in_stack_fffffffffffff578,in_stack_fffffffffffff570,in_stack_fffffffffffff568);
        local_528 = &local_530;
        bVar1 = cs_impl::any::is_protect(local_528);
        if (bVar1) {
          ptVar9 = new_value(in_stack_fffffffffffff320,(var *)in_stack_fffffffffffff318);
          pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
          *pptVar4 = &ptVar9->super_token_base;
        }
        cs_impl::any::~any((any *)0x151768);
      }
      tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x151794);
      break;
    default:
      goto LAB_0015298c;
    case asi_:
      local_360 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      bVar1 = true;
      if (*pptVar4 != (token_base *)0x0) {
        local_368 = (tree_node *)
                    tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
        pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
        bVar1 = *pptVar4 == (token_base *)0x0;
      }
      if (bVar1) {
        uVar7 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_388,"Wrong grammar for assign expression.",&local_389);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffff300.mData,
                   (string *)in_stack_fffffffffffff2f8);
        __cxa_throw(uVar7,&compile_error::typeinfo,compile_error::~compile_error);
      }
      tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               in_RDI,oVar12);
      tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
      opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               in_RDI,oVar12);
      break;
    case choice_:
      tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      if (*pptVar4 == (token_base *)0x0) {
        local_a68 = (token_signal *)0x0;
      }
      else {
        local_a68 = (token_signal *)
                    __dynamic_cast(*pptVar4,&token_base::typeinfo,&token_signal::typeinfo,0);
      }
      if ((local_a68 == (token_signal *)0x0) ||
         (sVar3 = token_signal::get_signal(local_a68), sVar3 != pair_)) {
        local_3d2 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3d0,"Wrong grammar for choice expression.",&local_3d1);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffff300.mData,
                   (string *)in_stack_fffffffffffff2f8);
        local_3d2 = 0;
        __cxa_throw(uVar7,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_3e0 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               in_RDI,oVar12);
      local_3f0 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
      local_3e8 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               in_RDI,oVar12);
      local_400 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
      local_3f8 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
      opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               in_RDI,oVar12);
      local_410 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      if (*pptVar4 == (token_base *)0x0) {
        local_aa0 = (token_value *)0x0;
      }
      else {
        local_aa0 = (token_value *)
                    __dynamic_cast(*pptVar4,&token_base::typeinfo,&token_value::typeinfo,0);
      }
      local_408 = local_aa0;
      if (local_aa0 != (token_value *)0x0) {
        token_value::get_value(local_aa0);
        cs_impl::any::type((any *)in_stack_fffffffffffff300.mData);
        bVar1 = std::type_info::operator==
                          (in_stack_fffffffffffff310,(type_info *)in_stack_fffffffffffff308);
        if (!bVar1) {
          local_462 = 1;
          uVar7 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_460,"Choice condition must be boolean.",&local_461);
          compile_error::compile_error
                    ((compile_error *)in_stack_fffffffffffff300.mData,
                     (string *)in_stack_fffffffffffff2f8);
          local_462 = 0;
          __cxa_throw(uVar7,&compile_error::typeinfo,compile_error::~compile_error);
        }
        token_value::get_value(local_408);
        pbVar6 = cs_impl::any::const_val<bool>((any *)in_stack_fffffffffffff380);
        if ((*pbVar6 & 1U) == 0) {
          local_428 = (tree_node *)
                      tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
          local_430 = (tree_node *)
                      tree_type<cs::token_base_*>::reserve_right
                                ((tree_type<cs::token_base_*> *)
                                 CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
                                 in_stack_fffffffffffff358);
        }
        else {
          local_418 = (tree_node *)
                      tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
          local_420 = (tree_node *)
                      tree_type<cs::token_base_*>::reserve_left
                                ((tree_type<cs::token_base_*> *)
                                 CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
                                 in_stack_fffffffffffff358);
        }
        local_438 = local_8.mData;
        tree_type<cs::token_base_*>::reserve_right
                  ((tree_type<cs::token_base_*> *)
                   CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350),
                   in_stack_fffffffffffff358);
      }
      break;
    case fcall_:
      local_548 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               in_RDI,oVar12);
      local_550 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
      opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               in_RDI,oVar12);
      local_560 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      local_558 = (token_value *)*pptVar4;
      local_570 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      local_568 = (token_arglist *)*pptVar4;
      if (((local_558 == (token_value *)0x0) || (local_568 == (token_arglist *)0x0)) ||
         (iVar2 = (*(local_568->super_token_base)._vptr_token_base[2])(), iVar2 != 0xd)) {
        local_592 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_590,"Wrong syntax for function call.",&local_591);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffff300.mData,
                   (string *)in_stack_fffffffffffff2f8);
        local_592 = 0;
        __cxa_throw(uVar7,&compile_error::typeinfo,compile_error::~compile_error);
      }
      iVar2 = (*(local_558->super_token_base)._vptr_token_base[2])();
      if (iVar2 == 7) {
        local_5a0 = token_value::get_value(local_558);
        cs_impl::any::type((any *)in_stack_fffffffffffff300.mData);
        bVar1 = std::type_info::operator==
                          (in_stack_fffffffffffff310,(type_info *)in_stack_fffffffffffff308);
        if (bVar1) {
          this_01 = cs_impl::any::const_val<cs::callable>((any *)in_stack_fffffffffffff380);
          bVar1 = callable::is_request_fold(this_01);
          if (bVar1) {
            local_5a8 = (token_expand *)0x0;
            local_5b0 = token_arglist::get_arglist(local_568);
            std::
            deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
            ::begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                     *)in_stack_fffffffffffff2f8);
            std::
            deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
            ::end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                   *)in_stack_fffffffffffff2f8);
            while( true ) {
              bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                      (_Self *)in_stack_fffffffffffff2f8);
              if (!bVar1) {
                pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
                local_618 = *pptVar4;
                std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
                          ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x151ba3);
                token_arglist::get_arglist(local_568);
                std::
                deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                        *)0x151bb8);
                std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve
                          (&in_stack_fffffffffffff330->constant_pool,
                           (size_type)in_stack_fffffffffffff328);
                local_638 = token_arglist::get_arglist(local_568);
                std::
                deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ::begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                         *)in_stack_fffffffffffff2f8);
                std::
                deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ::end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                       *)in_stack_fffffffffffff2f8);
                while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                               (_Self *)in_stack_fffffffffffff2f8), bVar1) {
                  local_680 = std::
                              _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                              ::operator*(&local_658);
                  local_688 = (tree_node *)
                              tree_type<cs::token_base_*>::root
                                        ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
                  pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
                  local_5a8 = (token_expand *)*pptVar4;
                  if ((local_5a8 == (token_expand *)0x0) ||
                     (iVar2 = (*(local_5a8->super_token_base)._vptr_token_base[2])(), iVar2 != 6)) {
                    std::
                    __shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x151e8e);
                    std::
                    __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x151e9a);
                    local_710 = (tree_node *)
                                tree_type<cs::token_base_*>::root
                                          ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8)
                    ;
                    runtime_type::parse_expr
                              (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                               (bool)in_stack_fffffffffffffc3f);
                    lvalue((var *)in_stack_fffffffffffff308);
                    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                               in_stack_fffffffffffff300.mData,
                               (value_type *)in_stack_fffffffffffff2f8);
                    cs_impl::any::~any((any *)0x151f25);
                    cs_impl::any::~any((any *)0x151f32);
                  }
                  else {
                    std::
                    __shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x151cc4);
                    std::
                    __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x151cd0);
                    token_expand::get_tree(local_5a8);
                    local_6a0 = (tree_node *)
                                tree_type<cs::token_base_*>::root
                                          ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8)
                    ;
                    runtime_type::parse_expr
                              (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                               (bool)in_stack_fffffffffffffc3f);
                    pdVar5 = cs_impl::any::
                             const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                                       ((any *)in_stack_fffffffffffff380);
                    cs_impl::any::~any((any *)0x151d4c);
                    local_6a8 = pdVar5;
                    local_690 = pdVar5;
                    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
                              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                               in_stack_fffffffffffff2f8);
                    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                               in_stack_fffffffffffff2f8);
                    while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                                   in_stack_fffffffffffff2f8), bVar1) {
                      local_6f0 = std::
                                  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
                                  ::operator*(&local_6c8);
                      lvalue((var *)in_stack_fffffffffffff308);
                      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                                ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                                 in_stack_fffffffffffff300.mData,
                                 (value_type *)in_stack_fffffffffffff2f8);
                      cs_impl::any::~any((any *)0x151e04);
                      std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
                      ::operator++((_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
                                    *)in_stack_fffffffffffff300.mData);
                    }
                  }
                  std::
                  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                  ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                                *)in_stack_fffffffffffff300.mData);
                }
                cs_impl::any::const_val<cs::callable>((any *)in_stack_fffffffffffff380);
                callable::call((callable *)in_stack_fffffffffffff308,
                               (vector *)in_stack_fffffffffffff300.mData);
                ptVar9 = new_value(in_stack_fffffffffffff320,(var *)in_stack_fffffffffffff318);
                pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
                *pptVar4 = &ptVar9->super_token_base;
                cs_impl::any::~any((any *)0x15201d);
                std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
                          ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                           in_stack_fffffffffffff310);
                return;
              }
              local_5f8 = std::
                          _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                          ::operator*(&local_5d0);
              local_600 = (tree_node *)
                          tree_type<cs::token_base_*>::root
                                    ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
              pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
              local_5a8 = (token_expand *)*pptVar4;
              if ((local_5a8 == (token_expand *)0x0) ||
                 (iVar2 = (*(local_5a8->super_token_base)._vptr_token_base[2])(), iVar2 != 6)) {
                local_610 = (tree_node *)
                            tree_type<cs::token_base_*>::root
                                      ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
                bVar1 = optimizable(in_stack_fffffffffffff308,
                                    (iterator *)in_stack_fffffffffffff300.mData);
              }
              else {
                token_expand::get_tree(local_5a8);
                local_608 = (tree_node *)
                            tree_type<cs::token_base_*>::root
                                      ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
                bVar1 = optimizable(in_stack_fffffffffffff308,
                                    (iterator *)in_stack_fffffffffffff300.mData);
              }
              if (((bVar1 ^ 0xffU) & 1) != 0) break;
              std::
              _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
              ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                            *)in_stack_fffffffffffff300.mData);
            }
            return;
          }
        }
        cs_impl::any::type((any *)in_stack_fffffffffffff300.mData);
        bVar1 = std::type_info::operator==
                          (in_stack_fffffffffffff310,(type_info *)in_stack_fffffffffffff308);
        if ((bVar1) &&
           (poVar8 = cs_impl::any::const_val<cs::object_method>((any *)in_stack_fffffffffffff380),
           (poVar8->is_request_fold & 1U) != 0)) {
          local_720 = (token_expand *)0x0;
          local_728 = token_arglist::get_arglist(local_568);
          std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                   *)in_stack_fffffffffffff2f8);
          std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                 *)in_stack_fffffffffffff2f8);
          while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                         (_Self *)in_stack_fffffffffffff2f8), bVar1) {
            local_770 = std::
                        _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                        ::operator*(&local_748);
            local_778 = (tree_node *)
                        tree_type<cs::token_base_*>::root
                                  ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
            pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
            local_720 = (token_expand *)*pptVar4;
            if ((local_720 == (token_expand *)0x0) ||
               (iVar2 = (*(local_720->super_token_base)._vptr_token_base[2])(), iVar2 != 6)) {
              local_788 = (tree_node *)
                          tree_type<cs::token_base_*>::root
                                    ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
              bVar1 = optimizable(in_stack_fffffffffffff308,
                                  (iterator *)in_stack_fffffffffffff300.mData);
            }
            else {
              token_expand::get_tree(local_720);
              local_780 = (tree_node *)
                          tree_type<cs::token_base_*>::root
                                    ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
              bVar1 = optimizable(in_stack_fffffffffffff308,
                                  (iterator *)in_stack_fffffffffffff300.mData);
            }
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              return;
            }
            std::
            _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
            ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                          *)in_stack_fffffffffffff300.mData);
          }
          pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
          local_790 = *pptVar4;
          local_798 = cs_impl::any::const_val<cs::object_method>((any *)in_stack_fffffffffffff380);
          local_7d0 = (undefined1 ****)&local_7c8;
          cs_impl::any::any((any *)in_stack_fffffffffffff300.mData,(any *)in_stack_fffffffffffff2f8)
          ;
          local_7c0 = (undefined1 ****)&local_7c8;
          local_7b8 = 1;
          std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x1522ed);
          __l._M_len = (size_type)in_stack_fffffffffffff340;
          __l._M_array = (iterator)in_stack_fffffffffffff338;
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
                    (&in_stack_fffffffffffff330->constant_pool,__l,in_stack_fffffffffffff328);
          std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x152321);
          ppppuVar11 = &local_7c8;
          local_c10 = &local_7c0;
          do {
            local_c10 = local_c10 + -1;
            cs_impl::any::~any((any *)0x152356);
          } while (local_c10 != ppppuVar11);
          token_arglist::get_arglist(local_568);
          std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                  *)0x152388);
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::reserve
                    (&in_stack_fffffffffffff330->constant_pool,(size_type)in_stack_fffffffffffff328)
          ;
          local_7e0 = token_arglist::get_arglist(local_568);
          std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                   *)in_stack_fffffffffffff2f8);
          std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                 *)in_stack_fffffffffffff2f8);
          while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                         (_Self *)in_stack_fffffffffffff2f8), bVar1) {
            local_828 = std::
                        _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                        ::operator*(&local_800);
            local_830 = (tree_node *)
                        tree_type<cs::token_base_*>::root
                                  ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
            pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
            local_720 = (token_expand *)*pptVar4;
            if ((local_720 == (token_expand *)0x0) ||
               (iVar2 = (*(local_720->super_token_base)._vptr_token_base[2])(), iVar2 != 6)) {
              std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x15275b);
              in_stack_fffffffffffff380 =
                   std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x152767);
              tree_type<cs::token_base_*>::root
                        ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
              runtime_type::parse_expr
                        (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                         (bool)in_stack_fffffffffffffc3f);
              lvalue((var *)in_stack_fffffffffffff308);
              std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                        ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                         in_stack_fffffffffffff300.mData,(value_type *)in_stack_fffffffffffff2f8);
              cs_impl::any::~any((any *)0x1527f2);
              cs_impl::any::~any((any *)0x1527ff);
            }
            else {
              std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x152494);
              std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1524a0);
              token_expand::get_tree(local_720);
              local_848 = (tree_node *)
                          tree_type<cs::token_base_*>::root
                                    ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
              runtime_type::parse_expr
                        (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                         (bool)in_stack_fffffffffffffc3f);
              pdVar5 = cs_impl::any::
                       const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                                 ((any *)in_stack_fffffffffffff380);
              cs_impl::any::~any((any *)0x15251c);
              local_850 = pdVar5;
              local_838 = pdVar5;
              std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
                        ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                         in_stack_fffffffffffff2f8);
              std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                        ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                         in_stack_fffffffffffff2f8);
              while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                             in_stack_fffffffffffff2f8), bVar1) {
                std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::
                operator*(&local_870);
                lvalue((var *)in_stack_fffffffffffff308);
                std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                          ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                           in_stack_fffffffffffff300.mData,(value_type *)in_stack_fffffffffffff2f8);
                cs_impl::any::~any((any *)0x1525d4);
                std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::
                operator++((_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
                            *)in_stack_fffffffffffff300.mData);
              }
            }
            std::
            _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
            ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                          *)in_stack_fffffffffffff300.mData);
          }
          cs_impl::any::const_val<cs::callable>((any *)in_stack_fffffffffffff380);
          callable::call((callable *)in_stack_fffffffffffff308,
                         (vector *)in_stack_fffffffffffff300.mData);
          ptVar9 = new_value(in_stack_fffffffffffff320,(var *)in_stack_fffffffffffff318);
          pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
          *pptVar4 = &ptVar9->super_token_base;
          cs_impl::any::~any((any *)0x1528e2);
          std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
                    ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                     in_stack_fffffffffffff310);
        }
      }
      break;
    case new_:
      local_2f8 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      if (*pptVar4 != (token_base *)0x0) {
        local_31a = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_318,"Wrong grammar for new expression.",&local_319);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffff300.mData,
                   (string *)in_stack_fffffffffffff2f8);
        local_31a = 0;
        __cxa_throw(uVar7,&compile_error::typeinfo,compile_error::~compile_error);
      }
      break;
    case gcnew_:
      local_328 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      if (*pptVar4 != (token_base *)0x0) {
        local_34a = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_348,"Wrong grammar for gcnew expression.",&local_349);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffff300.mData,
                   (string *)in_stack_fffffffffffff2f8);
        local_34a = 0;
        __cxa_throw(uVar7,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_358 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
      opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               in_RDI,oVar12);
      break;
    case arrow_:
      local_470 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      bVar1 = true;
      if (*pptVar4 != (token_base *)0x0) {
        local_478 = (tree_node *)
                    tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
        pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
        bVar1 = true;
        if (*pptVar4 != (token_base *)0x0) {
          local_480 = (tree_node *)
                      tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffff348);
          pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
          iVar2 = (*(*pptVar4)->_vptr_token_base[2])();
          bVar1 = iVar2 != 4;
        }
      }
      if (bVar1) {
        local_4a2 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4a0,"Wrong grammar for arrow expression.",&local_4a1);
        compile_error::compile_error
                  ((compile_error *)in_stack_fffffffffffff300.mData,
                   (string *)in_stack_fffffffffffff2f8);
        local_4a2 = 0;
        __cxa_throw(uVar7,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_4b0 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
      opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               in_RDI,oVar12);
    }
    break;
  case 4:
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14fa95);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14faa1);
    token_id::get_id((token_id *)local_70);
    domain_manager::get_var_optimizable<cs::var_id_const&>
              (in_stack_fffffffffffff338,(var_id *)in_stack_fffffffffffff330);
    bVar1 = cs_impl::any::usable(&local_30);
    if ((bVar1) && (bVar1 = cs_impl::any::is_protect(&local_30), bVar1)) {
      local_62 = 0;
      local_63 = 0;
      local_932 = 1;
      if (in_ECX != 1) {
        cs_impl::any::type((any *)in_stack_fffffffffffff300.mData);
        bVar1 = std::type_info::operator!=
                          ((type_info *)in_stack_fffffffffffff300.mData,
                           (type_info *)in_stack_fffffffffffff2f8);
        local_932 = 1;
        if (!bVar1) {
          cs_impl::any::const_val<std::shared_ptr<cs::name_space>>((any *)in_stack_fffffffffffff380)
          ;
          this_00 = std::
                    __shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x14fb9a);
          name_space::get_domain(this_00);
          std::allocator<char>::allocator();
          local_62 = 1;
          std::__cxx11::string::string(local_60,"__PRAGMA_CS_NAMESPACE_DEFINITION__",&local_61);
          local_63 = 1;
          bVar1 = domain_type::exist((domain_type *)in_stack_fffffffffffff300.mData,
                                     (string *)in_stack_fffffffffffff2f8);
          local_932 = bVar1 ^ 0xff;
        }
      }
      if ((local_63 & 1) != 0) {
        std::__cxx11::string::~string(local_60);
      }
      if ((local_62 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
      }
      if ((local_932 & 1) != 0) {
        ptVar9 = new_value(in_stack_fffffffffffff320,(var *)in_stack_fffffffffffff318);
        pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
        *pptVar4 = &ptVar9->super_token_base;
      }
    }
    cs_impl::any::~any((any *)0x14fcfc);
    break;
  default:
LAB_0015298c:
    oVar12 = (optm_type)((ulong)local_70 >> 0x20);
    it_00.mData = (tree_node *)in_RSI;
    tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffff348);
    opt_expr((compiler_type *)it_00.mData,
             (tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,oVar12
            );
    this_03 = (compiler_type *)it_00.mData;
    tree_type<cs::token_base_*>::iterator::right((iterator *)it_00.mData);
    opt_expr(this_03,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             in_RDI,oVar12);
    tree_type<cs::token_base_*>::iterator::left((iterator *)it_00.mData);
    bVar1 = optimizable(in_stack_fffffffffffff308,(iterator *)in_stack_fffffffffffff300.mData);
    bVar10 = false;
    if (bVar1) {
      tree_type<cs::token_base_*>::iterator::right((iterator *)it_00.mData);
      bVar10 = optimizable(in_stack_fffffffffffff308,(iterator *)in_stack_fffffffffffff300.mData);
    }
    if (bVar10 != false) {
      tree_type<cs::token_base_*>::iterator::data((iterator *)in_RSI);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x152ab4);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x152ac0);
      runtime_type::parse_expr
                (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,(bool)in_stack_fffffffffffffc3f
                );
      ptVar9 = new_value(in_stack_fffffffffffff320,(var *)in_stack_fffffffffffff318);
      cs_impl::any::~any((any *)0x152b02);
      tree_type<cs::token_base_*>::erase_left((tree_type<cs::token_base_*> *)in_RSI,it_00);
      tree_type<cs::token_base_*>::erase_right((tree_type<cs::token_base_*> *)in_RSI,it_00);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_RSI);
      *pptVar4 = &ptVar9->super_token_base;
    }
    break;
  case 6:
    local_88 = token_expand::get_tree((token_expand *)local_70);
    oVar12 = (optm_type)((ulong)local_70 >> 0x20);
    local_90 = (tree_node *)
               tree_type<cs::token_base_*>::root
                         ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
    opt_expr(in_RSI,(tree_type<cs::token_base_*> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI
             ,oVar12);
    break;
  case 8:
    pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
    local_78 = *pptVar4;
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14fd4c);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x14fd58);
    token_literal::get_data_abi_cxx11_((token_literal *)local_70);
    token_literal::get_literal_abi_cxx11_((token_literal *)local_70);
    runtime_type::get_string_literal
              (in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
    ptVar9 = new_value(in_stack_fffffffffffff320,(var *)in_stack_fffffffffffff318);
    pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
    *pptVar4 = &ptVar9->super_token_base;
    cs_impl::any::~any((any *)0x14fdfa);
    break;
  case 0xe:
    local_98 = (token_expand *)0x0;
    local_a0 = token_array::get_array(local_70);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)in_stack_fffffffffffff2f8);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffff2f8);
    this_02 = local_70;
    while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                   (_Self *)in_stack_fffffffffffff2f8), bVar1) {
      local_e8 = std::
                 _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                 ::operator*(&local_c0);
      local_f0 = (tree_node *)
                 tree_type<cs::token_base_*>::root
                           ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      local_98 = (token_expand *)*pptVar4;
      if ((local_98 == (token_expand *)0x0) ||
         (iVar2 = (*(local_98->super_token_base)._vptr_token_base[2])(), iVar2 != 6)) {
        optimize_expression(in_stack_fffffffffffff330,
                            (tree_type<cs::token_base_*> *)in_stack_fffffffffffff328,
                            (optm_type)((ulong)in_stack_fffffffffffff320 >> 0x20));
        local_108 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
        bVar1 = optimizable(in_stack_fffffffffffff308,(iterator *)in_stack_fffffffffffff300.mData);
      }
      else {
        local_f8 = token_expand::get_tree(local_98);
        optimize_expression(in_stack_fffffffffffff330,
                            (tree_type<cs::token_base_*> *)in_stack_fffffffffffff328,
                            (optm_type)((ulong)in_stack_fffffffffffff320 >> 0x20));
        local_100 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
        bVar1 = optimizable(in_stack_fffffffffffff308,(iterator *)in_stack_fffffffffffff300.mData);
      }
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return;
      }
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    *)in_stack_fffffffffffff300.mData);
    }
    pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
    local_110 = *pptVar4;
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x1500cb);
    local_168 = token_array::get_array(this_02);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)in_stack_fffffffffffff2f8);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffff2f8);
    while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                   (_Self *)in_stack_fffffffffffff2f8), bVar1) {
      local_1b0 = std::
                  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                  ::operator*(&local_188);
      local_1b8 = (tree_node *)
                  tree_type<cs::token_base_*>::root
                            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
      local_98 = (token_expand *)*pptVar4;
      if ((local_98 == (token_expand *)0x0) ||
         (iVar2 = (*(local_98->super_token_base)._vptr_token_base[2])(), iVar2 != 6)) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1503f4);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x150400);
        local_248 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
        runtime_type::parse_expr
                  (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                   (bool)in_stack_fffffffffffffc3f);
        copy(local_238,local_240);
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                   in_stack_fffffffffffff300.mData,(value_type *)in_stack_fffffffffffff2f8);
        cs_impl::any::~any((any *)0x15048b);
        cs_impl::any::~any((any *)0x150498);
      }
      else {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1501c7);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1501d3);
        token_expand::get_tree(local_98);
        local_1d0 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff2f8);
        runtime_type::parse_expr
                  (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                   (bool)in_stack_fffffffffffffc3f);
        pdVar5 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                           ((any *)in_stack_fffffffffffff380);
        cs_impl::any::~any((any *)0x15024f);
        local_1d8 = pdVar5;
        local_1c0 = pdVar5;
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffff2f8);
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffff2f8);
        while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                       in_stack_fffffffffffff2f8), bVar1) {
          local_220 = std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
                      ::operator*(&local_1f8);
          cs_impl::any::any((any *)in_stack_fffffffffffff300.mData,(any *)in_stack_fffffffffffff2f8)
          ;
          copy(local_228,local_230);
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                     in_stack_fffffffffffff300.mData,(value_type *)in_stack_fffffffffffff2f8);
          cs_impl::any::~any((any *)0x15031e);
          cs_impl::any::~any((any *)0x15032b);
          std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::operator++
                    ((_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *)
                     in_stack_fffffffffffff300.mData);
        }
      }
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    *)in_stack_fffffffffffff300.mData);
    }
    local_250 = local_160;
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffff2f8);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffff2f8);
    while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                   (_Self *)in_stack_fffffffffffff2f8), bVar1) {
      local_298 = std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>::operator*
                            (&local_270);
      add_constant((compiler_type *)in_stack_fffffffffffff300.mData,(var *)in_stack_fffffffffffff2f8
                  );
      std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>::operator++
                ((_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *)
                 in_stack_fffffffffffff300.mData);
    }
    cs_impl::any::
    make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
              (in_stack_fffffffffffff318);
    ptVar9 = new_value(in_stack_fffffffffffff320,(var *)in_stack_fffffffffffff318);
    pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffff340);
    *pptVar4 = &ptVar9->super_token_base;
    cs_impl::any::~any((any *)0x1505f6);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
               CONCAT17(in_stack_fffffffffffff357,in_stack_fffffffffffff350));
    break;
  case 0xf:
    local_2a8 = token_parallel::get_parallel((token_parallel *)local_70);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)in_stack_fffffffffffff2f8);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffff2f8);
    while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffff300.mData,
                                   (_Self *)in_stack_fffffffffffff2f8), bVar1) {
      local_2f0 = std::
                  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                  ::operator*(&local_2c8);
      optimize_expression(in_stack_fffffffffffff330,
                          (tree_type<cs::token_base_*> *)in_stack_fffffffffffff328,
                          (optm_type)((ulong)in_stack_fffffffffffff320 >> 0x20));
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    *)in_stack_fffffffffffff300.mData);
    }
  }
  return;
}

Assistant:

void
	compiler_type::opt_expr(tree_type<token_base *> &tree, tree_type<token_base *>::iterator it, optm_type do_optm)
	{
		if (!it.usable())
			return;
		token_base *token = it.data();
		if (token == nullptr)
			return;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id: {
			var value = context->instance->storage.get_var_optimizable(static_cast<token_id *>(token)->get_id());
			if (value.usable() && value.is_protect()) {
				if (do_optm == optm_type::enable_namespace_optm || value.type() != typeid(namespace_t) ||
				        !value.const_val<namespace_t>()->get_domain().exist("__PRAGMA_CS_NAMESPACE_DEFINITION__"))
					it.data() = new_value(value);
			}
			return;
		}
		case token_types::literal: {
			token_literal *ptr = static_cast<token_literal *>(token);
			token_base *oldt = it.data();
			try {
				it.data() = new_value(context->instance->get_string_literal(ptr->get_data(), ptr->get_literal()));
			}
			catch (...) {
				it.data() = oldt;
			}
			return;
		}
		case token_types::expand: {
			tree_type<token_base *> &tree = static_cast<token_expand *>(token)->get_tree();
			opt_expr(tree, tree.root(), do_optm);
			return;
		}
		case token_types::array: {
			token_base *ptr = nullptr;
			for (auto &tree: static_cast<token_array *>(token)->get_array()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					auto &child_tree = static_cast<token_expand *>(ptr)->get_tree();
					optimize_expression(child_tree, do_optm);
					if (!optimizable(child_tree.root()))
						return;
				}
				else {
					optimize_expression(tree, do_optm);
					if (!optimizable(tree.root()))
						return;
				}
			}
			token_base *oldt = it.data();
			try {
				array arr;
				for (auto &tree: static_cast<token_array *>(token)->get_array()) {
					ptr = tree.root().data();
					if (ptr != nullptr && ptr->get_type() == token_types::expand) {
						const auto &child_arr = context->instance->parse_expr(
						                            static_cast<token_expand *>(ptr)->get_tree().root()).const_val<array>();
						for (auto &it: child_arr)
							arr.push_back(copy(it));
					}
					else
						arr.push_back(copy(context->instance->parse_expr(tree.root())));
				}
				for (auto &it: arr)
					add_constant(it);
				it.data() = new_value(var::make<array>(std::move(arr)));
			}
			catch (...) {
				it.data() = oldt;
			}
			return;
		}
		case token_types::parallel: {
			for (auto &tree: static_cast<token_parallel *>(token)->get_parallel())
				optimize_expression(tree, do_optm);
			return;
		}
		case token_types::signal: {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			default:
				break;
			case signal_types::new_:
				// Fix(2020-11-26): Terminate new expression optimization
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for new expression.");
				return;
			case signal_types::gcnew_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for gcnew expression.");
				opt_expr(tree, it.right(), do_optm);
				return;
			case signal_types::asi_:
				if (it.left().data() == nullptr || it.right().data() == nullptr)
					throw compile_error("Wrong grammar for assign expression.");
				opt_expr(tree, it.left(), do_optm);
				opt_expr(tree, it.right(), do_optm);
				return;
			case signal_types::choice_: {
				token_signal *sig = dynamic_cast<token_signal *>(it.right().data());
				if (sig == nullptr || sig->get_signal() != signal_types::pair_)
					throw compile_error("Wrong grammar for choice expression.");
				opt_expr(tree, it.left(), do_optm);
				opt_expr(tree, it.right().left(), do_optm);
				opt_expr(tree, it.right().right(), do_optm);
				token_value *val = dynamic_cast<token_value *>(it.left().data());
				if (val != nullptr) {
					if (val->get_value().type() == typeid(boolean)) {
						if (val->get_value().const_val<boolean>())
							tree.reserve_left(it.right());
						else
							tree.reserve_right(it.right());
						tree.reserve_right(it);
					}
					else
						throw compile_error("Choice condition must be boolean.");
				}
				return;
			}
			case signal_types::arrow_:
				if (it.left().data() == nullptr || it.right().data() == nullptr ||
				        it.right().data()->get_type() != token_types::id)
					throw compile_error("Wrong grammar for arrow expression.");
				opt_expr(tree, it.left(), do_optm);
				return;
			case signal_types::dot_: {
				tree_type<token_base *> ltree(it.left());
				opt_expr(tree, it.left(), optm_type::enable_namespace_optm);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for dot expression.");
				if (lptr != nullptr && lptr->get_type() == token_types::value) {
					const var &a = static_cast<token_value *>(lptr)->get_value();
					token_base *orig_ptr = it.data();
					try {
						const var &v = context->instance->parse_dot(a, rptr);
						if (v.is_protect())
							it.data() = new_value(v);
					}
					catch (...) {
						// Fix(2020-12-05): Broken AST structure caused by tree_type::merge
						it.data() = orig_ptr;
						tree.merge(it.left(), ltree);
					}
				}
				return;
			}
			case signal_types::fcall_: {
				opt_expr(tree, it.left(), do_optm);
				opt_expr(tree, it.right(), do_optm);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong syntax for function call.");
				if (lptr->get_type() == token_types::value) {
					var &a = static_cast<token_value *>(lptr)->get_value();
					if (a.type() == typeid(callable) && a.const_val<callable>().is_request_fold()) {
						token_base *ptr = nullptr;
						for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
							ptr = tree.root().data();
							if (ptr != nullptr && ptr->get_type() == token_types::expand) {
								if (!optimizable(static_cast<token_expand *>(ptr)->get_tree().root()))
									return;
							}
							else {
								if (!optimizable(tree.root()))
									return;
							}
						}
						token_base *oldt = it.data();
						try {
							vector args;
							args.reserve(static_cast<token_arglist *>(rptr)->get_arglist().size());
							for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
								ptr = tree.root().data();
								if (ptr != nullptr && ptr->get_type() == token_types::expand) {
									const auto &arr = context->instance->parse_expr(
									                      static_cast<token_expand *>(ptr)->get_tree().root()).const_val<array>();
									for (auto &it: arr)
										args.push_back(lvalue(it));
								}
								else
									args.push_back(lvalue(context->instance->parse_expr(tree.root())));
							}
							it.data() = new_value(a.const_val<callable>().call(args));
						}
						catch (...) {
							it.data() = oldt;
						}
					}
					else if (a.type() == typeid(object_method) &&
					         a.const_val<object_method>().is_request_fold) {
						token_base *ptr = nullptr;
						for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
							ptr = tree.root().data();
							if (ptr != nullptr && ptr->get_type() == token_types::expand) {
								if (!optimizable(static_cast<token_expand *>(ptr)->get_tree().root()))
									return;
							}
							else {
								if (!optimizable(tree.root()))
									return;
							}
						}
						token_base *oldt = it.data();
						try {
							const auto &om = a.const_val<object_method>();
							vector args{om.object};
							args.reserve(static_cast<token_arglist *>(rptr)->get_arglist().size());
							for (auto &tree: static_cast<token_arglist *>(rptr)->get_arglist()) {
								ptr = tree.root().data();
								if (ptr != nullptr && ptr->get_type() == token_types::expand) {
									const auto &arr = context->instance->parse_expr(
									                      static_cast<token_expand *>(ptr)->get_tree().root()).const_val<array>();
									for (auto &it: arr)
										args.push_back(lvalue(it));
								}
								else
									args.push_back(lvalue(context->instance->parse_expr(tree.root())));
							}
							it.data() = new_value(om.callable.const_val<callable>().call(args));
						}
						catch (...) {
							it.data() = oldt;
						}
					}
				}
				return;
			}
			}
		}
		}
		opt_expr(tree, it.left(), do_optm);
		opt_expr(tree, it.right(), do_optm);
		if (optimizable(it.left()) && optimizable(it.right())) {
			token_base *oldt = it.data();
			try {
				token_value *token = new_value(context->instance->parse_expr(it));
				tree.
				erase_left(it);
				tree.
				erase_right(it);
				it.data() = token;
			}
			catch (...) {
				it.data() = oldt;
			}
		}
	}